

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::init(ShaderAtomicOpCase *this,EVP_PKEY_CTX *ctx)

{
  AtomicOperandType AVar1;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar2;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  long *plVar6;
  ShaderProgram *pSVar7;
  TestError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  DataType DVar9;
  bool *pbVar10;
  ulong uVar11;
  long lVar12;
  string castBeg;
  ostringstream src;
  undefined1 auStack_2c8 [4];
  AtomicOperandType local_2c4;
  Hex<8UL> local_2c0;
  value_type local_2b8;
  long *local_298;
  long local_290;
  long local_288 [2];
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [376];
  
  AVar1 = this->m_operandType;
  __s = glu::getPrecisionName(this->m_precision);
  __s_00 = glu::getDataTypeName(this->m_type);
  DVar9 = TYPE_UINT;
  if (AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    DVar9 = this->m_type;
  }
  local_2c4 = AVar1;
  __s_01 = glu::getDataTypeName(DVar9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar3 = glu::getGLSLVersionDeclaration(version);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x120);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(local_size_x = ",0x16);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", local_size_y = ",0x11);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", local_size_z = ",0x11);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"layout(binding = 0) buffer InOut\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar5->_vptr_basic_ostream[-3] + (int)poVar5);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_00,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," inputValues[",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar5->_vptr_basic_ostream[-3] + (int)poVar5);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  if (__s_01 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s_01);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_01,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," outputValues[",0xe);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
  pcVar3 = "coherent ";
  pbVar10 = ::glcts::fixed_sample_locations_values + 1;
  if (local_2c4 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    pcVar3 = ::glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,pcVar3,(ulong)(local_2c4 == ATOMIC_OPERAND_BUFFER_VARIABLE) * 9);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar5->_vptr_basic_ostream[-3] + (int)poVar5);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  if (__s_01 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s_01);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_01,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," groupValues[",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} sb_inout;\n",0xc);
  if (local_2c4 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"shared ",7);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x120);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x120);
    }
    else {
      sVar4 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," s_var;\n",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\tuint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",0x4d)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\tuint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
             ,0x84);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tuint globalOffs = localSize*globalNdx;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tuint offset     = globalOffs + gl_LocalInvocationIndex;\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if (local_2c4 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tsb_inout.outputValues[offset] = ",0x21);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->m_funcName)._M_dataplus._M_p,
                        (this->m_funcName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n",0x41);
  }
  else {
    if (this->m_type == TYPE_UINT) {
      local_278._0_8_ = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,0x1af8059);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,__s_01,(allocator<char> *)&local_298);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      local_278._0_8_ = local_268;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar8) {
        local_268[0]._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        local_268[0]._M_string_length = plVar6[3];
      }
      else {
        local_268[0]._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        local_278._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
      }
      local_278._8_8_ = plVar6[1];
      *plVar6 = (long)pbVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((size_type *)local_2c0.value != &local_2b8._M_string_length) {
        operator_delete((void *)local_2c0.value,local_2b8._M_string_length + 1);
      }
    }
    DVar9 = this->m_type;
    if (DVar9 != TYPE_UINT) {
      pbVar10 = (bool *)0x1adddc7;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tif (gl_LocalInvocationIndex == 0u)\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t\ts_var = ",10);
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x120);
    }
    else {
      sVar4 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    local_2c0.value = (deUint64)this->m_initialValue;
    poVar5 = tcu::Format::Hex<8UL>::toStream(&local_2c0,(ostream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"u);\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tbarrier();\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s_00,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," res = ",7);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->m_funcName)._M_dataplus._M_p,
                        (this->m_funcName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"(s_var, sb_inout.inputValues[offset]);\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\tsb_inout.outputValues[offset] = ",0x21);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"res",3);
    uVar11 = (ulong)(DVar9 != TYPE_UINT);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pbVar10,uVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tbarrier();\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\tif (gl_LocalInvocationIndex == 0u)\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\t\tsb_inout.groupValues[globalNdx] = ",0x24);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_278._0_8_,local_278._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s_var",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pbVar10,uVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
        local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_dataplus._M_p + 1));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_278,0,0xac);
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8[8] = 0;
  local_1c8._9_7_ = 0;
  local_1c8[0x10] = 0;
  local_1c8._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  local_2c0.value._0_4_ = 5;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_298,local_290 + (long)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + (local_2c0.value & 0xffffffff) * 0x18),&local_2b8);
  glu::ShaderProgram::ShaderProgram(pSVar7,renderCtx,(ProgramSources *)local_278);
  this->m_program = pSVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1e8);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  pSVar7 = this->m_program;
  if ((pSVar7->m_program).m_info.linkOk != false) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    iVar2 = std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return iVar2;
  }
  glu::ShaderProgram::~ShaderProgram(pSVar7);
  operator_delete(pSVar7,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Compile failed","");
  tcu::TestError::TestError(this_00,(string *)local_278);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderAtomicOpCase::init (void)
{
	const bool			isSSBO		= m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
	const char*			precName	= getPrecisionName(m_precision);
	const char*			typeName	= getDataTypeName(m_type);

	const DataType		outType		= isSSBO ? m_type : glu::TYPE_UINT;
	const char*			outTypeName	= getDataTypeName(outType);

	const deUint32		numValues	= product(m_workGroupSize)*product(m_numWorkGroups);
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(getContextTypeGLSLVersion(m_context.getRenderContext().getType())) << "\n"
		<< "layout(local_size_x = " << m_workGroupSize.x()
		<< ", local_size_y = " << m_workGroupSize.y()
		<< ", local_size_z = " << m_workGroupSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut\n"
		<< "{\n"
		<< "	" << precName << " " << typeName << " inputValues[" << numValues << "];\n"
		<< "	" << precName << " " << outTypeName << " outputValues[" << numValues << "];\n"
		<< "	" << (isSSBO ? "coherent " : "") << precName << " " << outTypeName << " groupValues[" << product(m_numWorkGroups) << "];\n"
		<< "} sb_inout;\n";

	if (!isSSBO)
		src << "shared " << precName << " " << typeName << " s_var;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "	uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "	uint globalOffs = localSize*globalNdx;\n"
		<< "	uint offset     = globalOffs + gl_LocalInvocationIndex;\n"
		<< "\n";

	if (isSSBO)
	{
		DE_ASSERT(outType == m_type);
		src << "	sb_inout.outputValues[offset] = " << m_funcName << "(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n";
	}
	else
	{
		const string		castBeg	= outType != m_type ? (string(outTypeName) + "(") : string("");
		const char* const	castEnd	= outType != m_type ? ")" : "";

		src << "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		s_var = " << typeName << "(" << tcu::toHex(m_initialValue) << "u);\n"
			<< "	barrier();\n"
			<< "	" << precName << " " << typeName << " res = " << m_funcName << "(s_var, sb_inout.inputValues[offset]);\n"
			<< "	sb_inout.outputValues[offset] = " << castBeg << "res" << castEnd << ";\n"
			<< "	barrier();\n"
			<< "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		sb_inout.groupValues[globalNdx] = " << castBeg << "s_var" << castEnd << ";\n";
	}

	src << "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}